

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exception.h
# Opt level: O2

void __thiscall
calculator::DivZeroException::DivZeroException(DivZeroException *this,double x,int y)

{
  string local_b8;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  ValueException::ValueException(&this->super_ValueException);
  *(undefined ***)&(this->super_ValueException).super_SyntaxError = &PTR__SyntaxError_00116888;
  std::__cxx11::to_string(&local_98,x);
  std::operator+(&local_78,"Error: div zero/0 error: ",&local_98);
  std::operator+(&local_58,&local_78,"/");
  std::__cxx11::to_string(&local_b8,y);
  std::operator+(&local_38,&local_58,&local_b8);
  std::__cxx11::string::operator=
            ((string *)&(this->super_ValueException).super_SyntaxError.error_msg,(string *)&local_38
            );
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_98);
  return;
}

Assistant:

DivZeroException(double x, int y) {
        error_msg = "Error: div zero/0 error: " + std::to_string(x) + "/" +
                    std::to_string(y);
    }